

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_fl_add(asmcode *code,compiler_options *param_2)

{
  int local_c8 [32];
  unsigned_long local_48;
  operand local_3c [2];
  operation local_34;
  unsigned_long local_30;
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_1c = AND;
  local_24[1] = 9;
  local_24[0] = NUMBER;
  local_30 = 0xfffffffffffffff8;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1c,local_24 + 1,local_24,&local_30);
  local_34 = AND;
  local_3c[1] = 10;
  local_3c[0] = NUMBER;
  local_48 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            ((asmcode *)param_1_local,&local_34,local_3c + 1,local_3c,&local_48);
  local_c8[0x1f] = 0x43;
  local_c8[0x1e] = 0x43;
  local_c8[0x1d] = 0x19;
  local_c8[0x1c] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 0x1f),(operand *)(local_c8 + 0x1e),
             (operand *)(local_c8 + 0x1d),local_c8 + 0x1c);
  local_c8[0x1b] = 0x43;
  local_c8[0x1a] = 0x44;
  local_c8[0x19] = 0x1a;
  local_c8[0x18] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 0x1b),(operand *)(local_c8 + 0x1a),
             (operand *)(local_c8 + 0x19),local_c8 + 0x18);
  local_c8[0x17] = 1;
  local_c8[0x16] = 0x43;
  local_c8[0x15] = 0x44;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 0x17),(operand *)(local_c8 + 0x16),
             (operand *)(local_c8 + 0x15));
  local_c8[0x14] = 0x40;
  local_c8[0x13] = 9;
  local_c8[0x12] = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 0x14),(operand *)(local_c8 + 0x13),
             (operand *)(local_c8 + 0x12));
  local_c8[0x11] = 0x40;
  local_c8[0x10] = 0x20;
  local_c8[0xf] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 0x11),(operand *)(local_c8 + 0x10),
             (operand *)(local_c8 + 0xf));
  local_c8[0xe] = 0x43;
  local_c8[0xd] = 0x20;
  local_c8[0xc] = 8;
  local_c8[0xb] = 0x43;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 0xe),(operand *)(local_c8 + 0xd),
             local_c8 + 0xc,(operand *)(local_c8 + 0xb));
  local_c8[10] = 0x40;
  local_c8[9] = 9;
  local_c8[8] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 10),(operand *)(local_c8 + 9),
             (operand *)(local_c8 + 8));
  local_c8[7] = 0x49;
  local_c8[6] = 9;
  local_c8[5] = 0x39;
  local_c8[4] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 7),(operand *)(local_c8 + 6),
             (operand *)(local_c8 + 5),local_c8 + 4);
  local_c8[3] = 0;
  local_c8[2] = 0x10;
  local_c8[1] = 0x39;
  local_c8[0] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,(operation *)(local_c8 + 3),(operand *)(local_c8 + 2),
             (operand *)(local_c8 + 1),local_c8);
  return;
}

Assistant:

void inline_fl_add(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::AND, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::AND, ASM::asmcode::RBX, ASM::asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM0, ASM::asmcode::MEM_RAX, CELLS(1));
  code.add(ASM::asmcode::MOVSD, ASM::asmcode::XMM1, ASM::asmcode::MEM_RBX, CELLS(1));
  code.add(ASM::asmcode::ADDSD, ASM::asmcode::XMM0, ASM::asmcode::XMM1);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::MEM_RAX);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);
  code.add(ASM::asmcode::MOVSD, MEM_ALLOC, CELLS(1), ASM::asmcode::XMM0);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  }